

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactoryTests.cpp
# Opt level: O3

void verifyFindingReportersByName
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *inputs,string *osPrefix)

{
  ReporterFactory reporterFactory;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  string local_d8;
  Options local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  local_50;
  
  ApprovalTests::ReporterFactory::ReporterFactory((ReporterFactory *)&local_50);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  local_e0 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/reporters/ReporterFactoryTests.cpp:84:38)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/reporters/ReporterFactoryTests.cpp:84:38)>
             ::_M_manager;
  local_b8.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_b8.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8.scrubber_._M_invoker = (_Invoker_type)0x0;
  local_b8.reporter_ = (Reporter *)0x0;
  local_b8.scrubber_.super__Function_base._M_functor._8_8_ = 0;
  local_b8.scrubber_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_b8.fileOptions_.fileExtensionWithDot_.field_2._8_8_ = 0;
  local_b8.scrubber_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_b8.fileOptions_.fileExtensionWithDot_._M_string_length = 0;
  local_b8.fileOptions_.fileExtensionWithDot_.field_2._M_allocated_capacity = 0;
  local_b8.fileOptions_.options_ = (Options *)0x0;
  local_b8.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p = (pointer)0x0;
  local_b8.usingDefaultScrubber_ = false;
  local_b8._97_7_ = 0;
  local_f8._M_unused._M_object = &local_50;
  local_f8._8_8_ = osPrefix;
  ApprovalTests::Options::Options(&local_b8);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verifyAll<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_d8,inputs,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
              *)&local_f8,&local_b8);
  if (local_b8.namer_.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.namer_.
               super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b8.scrubber_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.scrubber_.super__Function_base._M_manager)
              ((_Any_data *)&local_b8.scrubber_,(_Any_data *)&local_b8.scrubber_,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p !=
      &local_b8.fileOptions_.fileExtensionWithDot_.field_2) {
    operator_delete(local_b8.fileOptions_.fileExtensionWithDot_._M_dataplus._M_p,
                    local_b8.fileOptions_.fileExtensionWithDot_.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void verifyFindingReportersByName(const std::vector<std::string>& inputs,
                                  const std::string& osPrefix)
{
    ReporterFactory reporterFactory;

    Approvals::verifyAll("", inputs, [&](auto input, auto& stream) {
        stream << input << " => " << reporterFactory.findReporterName(osPrefix, input);
    });
}